

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O0

void Q_SetEntry(QMatrix *Q,size_t RoC,size_t Entry,size_t Pos,Real Val)

{
  LASErrIdType LVar1;
  Real Val_local;
  size_t Pos_local;
  size_t Entry_local;
  size_t RoC_local;
  QMatrix *Q_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if ((((RoC == 0) || (Q->Dim < RoC)) || (Pos == 0)) || ((Q->Dim < Pos || (Q->Len[RoC] <= Entry)))
       ) {
      LASError(LASRangeErr,"Q_SetEntry",Q->Name,(char *)0x0,(char *)0x0);
    }
    else {
      Q->El[RoC][Entry].Pos = Pos;
      Q->El[RoC][Entry].Val = Val;
    }
  }
  return;
}

Assistant:

void Q_SetEntry(QMatrix *Q, size_t RoC, size_t Entry, size_t Pos, Real Val)
/* set a new matrix entry */
{
    if (LASResult() == LASOK) {
        if ((RoC > 0 && RoC <= Q->Dim && Pos > 0 && Pos <= Q->Dim) &&
            (Entry < Q->Len[RoC])) {
            Q->El[RoC][Entry].Pos = Pos;
            Q->El[RoC][Entry].Val = Val;
        } else {
            LASError(LASRangeErr, "Q_SetEntry", Q->Name, NULL, NULL);
        }
    }
}